

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha3.c
# Opt level: O0

int sha3_done(hash_state *md,uchar *hash)

{
  long lVar1;
  void *in_RSI;
  ulong *in_RDI;
  ulong64 __t;
  uint i;
  uint local_14;
  
  if (in_RDI == (ulong *)0x0) {
    fprintf(_stderr,"\nwarning: ARGCHK failed at %s:%d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/sonntex[P]smhasher/sha3.c",0xec)
    ;
  }
  if (in_RSI == (void *)0x0) {
    fprintf(_stderr,"\nwarning: ARGCHK failed at %s:%d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/sonntex[P]smhasher/sha3.c",0xed)
    ;
  }
  in_RDI[(ulong)*(ushort *)((long)in_RDI + 0x19a) + 1] =
       *in_RDI ^ 6L << (((byte)(short)in_RDI[0x33] & 7) << 3) ^
       in_RDI[(ulong)*(ushort *)((long)in_RDI + 0x19a) + 1];
  lVar1 = (long)(int)(0x18 - (uint)*(ushort *)((long)in_RDI + 0x19c));
  in_RDI[lVar1 + 1] = in_RDI[lVar1 + 1] ^ 0x8000000000000000;
  keccakf((ulong64 *)md->dummy);
  for (local_14 = 0; local_14 < 0x19; local_14 = local_14 + 1) {
    *(ulong *)((long)in_RDI + (ulong)(local_14 << 3) + 0xd0) = in_RDI[(ulong)local_14 + 1];
  }
  memcpy(in_RSI,in_RDI + 0x1a,(long)(int)((uint)*(ushort *)((long)in_RDI + 0x19c) << 2));
  return 0;
}

Assistant:

int sha3_done(hash_state *md, unsigned char *hash)
{
   unsigned i;

   LTC_ARGCHK(md   != NULL);
   LTC_ARGCHK(hash != NULL);

   md->sha3.s[md->sha3.word_index] ^= (md->sha3.saved ^ (CONST64(0x06) << (md->sha3.byte_index * 8)));
   md->sha3.s[SHA3_KECCAK_SPONGE_WORDS - md->sha3.capacity_words - 1] ^= CONST64(0x8000000000000000);
   keccakf(md->sha3.s);

   /* store sha3.s[] as little-endian bytes into sha3.sb */
   for(i = 0; i < SHA3_KECCAK_SPONGE_WORDS; i++) {
      STORE64L(md->sha3.s[i], md->sha3.sb + i * 8);
   }

   XMEMCPY(hash, md->sha3.sb, md->sha3.capacity_words * 4);
   return CRYPT_OK;
}